

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall duckdb_re2::DFA::InlinedSearchLoop<true,true,false>(DFA *this,SearchParams *params)

{
  byte bVar1;
  const_pointer pcVar2;
  bool bVar3;
  uint uVar4;
  const_pointer pcVar5;
  State *pSVar6;
  long lVar7;
  State *pSVar8;
  State *pSVar9;
  int *__dest;
  ulong uVar10;
  size_t sVar11;
  uint c;
  const_pointer data;
  State *state;
  int *local_220;
  int *local_210;
  StateSaver local_208;
  Prog *local_1e0;
  StateSaver local_1d8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar2 = (params->text).data_;
  pSVar9 = params->start;
  data = pcVar2 + (params->text).size_;
  if ((pSVar9->flag_ & 0x100) == 0) {
    local_1e0 = this->prog_;
    local_220 = (int *)0x0;
    state = pSVar9;
    do {
      if ((data == pcVar2) ||
         ((pcVar5 = data, state == pSVar9 &&
          (pcVar5 = (const_pointer)Prog::PrefixAccel(this->prog_,data,(long)pcVar2 - (long)data),
          data = pcVar2, pcVar5 == (const_pointer)0x0)))) {
        pcVar5 = (params->text).data_;
        if (pcVar5 == (params->context).data_) {
          uVar4 = this->prog_->bytemap_range_;
          c = 0x100;
        }
        else {
          bVar1 = pcVar5[-1];
          c = (uint)bVar1;
          uVar4 = (uint)this->prog_->bytemap_[bVar1];
        }
        pSVar9 = state->next_[(int)uVar4]._M_b._M_p;
        if ((pSVar9 == (State *)0x0) &&
           (pSVar9 = RunStateOnByteUnlocked(this,state,c), pSVar9 == (State *)0x0)) {
          if (state < (State *)0x3) {
            local_208.inst_ = (int *)0x0;
            local_208.ninst_ = 0;
            local_208.flag_ = 0;
            local_208.is_special_ = true;
            __dest = (int *)0x0;
            local_208.dfa_ = this;
            local_208.special_ = state;
          }
          else {
            local_208.is_special_ = false;
            local_208.special_ = (State *)0x0;
            local_208.ninst_ = state->ninst_;
            local_208.flag_ = state->flag_;
            lVar7 = (long)local_208.ninst_;
            uVar10 = 0xffffffffffffffff;
            if (-1 < local_208.ninst_) {
              uVar10 = lVar7 * 4;
            }
            local_208.dfa_ = this;
            __dest = (int *)operator_new__(uVar10);
            local_208.inst_ = __dest;
            memmove(__dest,state->inst_,lVar7 * 4);
          }
          ResetCache(this,params->cache_lock);
          pSVar9 = StateSaver::Restore(&local_208);
          if (pSVar9 == (State *)0x0) {
LAB_011cc4e6:
            params->failed = true;
            bVar3 = false;
            pSVar9 = (State *)0x0;
          }
          else {
            pSVar9 = RunStateOnByteUnlocked(this,pSVar9,c);
            if (pSVar9 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after Reset",0x29);
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_011cc4e6;
            }
            bVar3 = true;
          }
          if (((State *)0x2 < state) && (__dest != (int *)0x0)) {
            operator_delete__(__dest);
          }
          if (!bVar3) {
            return false;
          }
        }
        if (pSVar9 < (State *)0x3) {
          if (pSVar9 == (State *)&DAT_00000001) {
LAB_011cc57a:
            params->ep = (char *)0x0;
            return false;
          }
LAB_011cc30d:
          params->ep = pcVar2;
          return true;
        }
        uVar4 = pSVar9->flag_ & 0x100;
        if (uVar4 == 0) {
          data = (const_pointer)0x0;
          goto LAB_011cc591;
        }
        if (((params->matches == (SparseSet *)0x0) || (this->kind_ != kManyMatch)) ||
           ((long)pSVar9->ninst_ < 1)) goto LAB_011cc591;
        uVar10 = (long)pSVar9->ninst_ + 1;
        goto LAB_011cc546;
      }
      data = pcVar5 + -1;
      bVar1 = pcVar5[-1];
      pSVar6 = state->next_[local_1e0->bytemap_[bVar1]]._M_b._M_p;
      if (pSVar6 == (State *)0x0) {
        pSVar6 = RunStateOnByteUnlocked(this,state,(uint)bVar1);
        if (pSVar6 == (State *)0x0) {
          if (((dfa_should_bail_when_slow == '\x01') && (local_220 != (int *)0x0)) &&
             (((ulong)((long)data - (long)local_220) <
               (this->state_cache_)._M_h._M_element_count * 10 && (this->kind_ != kManyMatch)))) {
            params->failed = true;
            return false;
          }
          if (pSVar9 < (State *)0x3) {
            local_208.inst_ = (int *)0x0;
            local_208.ninst_ = 0;
            local_208.flag_ = 0;
            local_208.is_special_ = true;
            local_220 = (int *)0x0;
            local_208.dfa_ = this;
            local_208.special_ = pSVar9;
          }
          else {
            local_208.is_special_ = false;
            local_208.special_ = (State *)0x0;
            local_208.ninst_ = pSVar9->ninst_;
            local_208.flag_ = pSVar9->flag_;
            lVar7 = (long)local_208.ninst_;
            sVar11 = lVar7 * 4;
            if (local_208.ninst_ < 0) {
              sVar11 = 0xffffffffffffffff;
            }
            local_208.dfa_ = this;
            local_220 = (int *)operator_new__(sVar11);
            local_208.inst_ = local_220;
            memmove(local_220,pSVar9->inst_,lVar7 * 4);
          }
          local_1d8.dfa_ = this;
          if (state < (State *)0x3) {
            local_1d8.inst_ = (int *)0x0;
            local_1d8.ninst_ = 0;
            local_1d8.flag_ = 0;
            local_1d8.is_special_ = true;
            local_210 = (int *)0x0;
            local_1d8.special_ = state;
          }
          else {
            local_1d8.is_special_ = false;
            local_1d8.special_ = (State *)0x0;
            local_1d8.ninst_ = state->ninst_;
            local_1d8.flag_ = state->flag_;
            lVar7 = (long)local_1d8.ninst_;
            sVar11 = lVar7 * 4;
            if (local_1d8.ninst_ < 0) {
              sVar11 = 0xffffffffffffffff;
            }
            local_210 = (int *)operator_new__(sVar11);
            local_1d8.inst_ = local_210;
            memmove(local_210,state->inst_,lVar7 * 4);
          }
          ResetCache(this,params->cache_lock);
          pSVar8 = StateSaver::Restore(&local_208);
          if ((pSVar8 == (State *)0x0) ||
             (pSVar6 = StateSaver::Restore(&local_1d8), pSVar6 == (State *)0x0)) {
LAB_011cc25c:
            params->failed = true;
            bVar3 = false;
            pSVar6 = (State *)0x0;
          }
          else {
            pSVar6 = RunStateOnByteUnlocked(this,pSVar6,(uint)bVar1);
            if (pSVar6 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after ResetCache",0x2e)
              ;
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_011cc25c;
            }
            bVar3 = true;
          }
          if (((State *)0x2 < state) && (local_210 != (int *)0x0)) {
            operator_delete__(local_210);
          }
          if (((State *)0x2 < pSVar9) && (local_220 != (int *)0x0)) {
            operator_delete__(local_220);
          }
          pSVar9 = pSVar8;
          local_220 = (int *)data;
          if (!bVar3) {
            return false;
          }
        }
      }
      if (pSVar6 < (State *)0x3) {
        if (pSVar6 == (State *)&DAT_00000001) goto LAB_011cc57a;
        goto LAB_011cc30d;
      }
      state = pSVar6;
    } while ((pSVar6->flag_ & 0x100) == 0);
    if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
       (0 < (long)pSVar6->ninst_)) {
      uVar10 = (long)pSVar6->ninst_ + 1;
      do {
        if (pSVar6->inst_[uVar10 - 2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,pSVar6->inst_[uVar10 - 2]);
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
    params->ep = pcVar5;
  }
  else {
    if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
       (0 < (long)pSVar9->ninst_)) {
      uVar10 = (long)pSVar9->ninst_ + 1;
      do {
        if (pSVar9->inst_[uVar10 - 2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,pSVar9->inst_[uVar10 - 2]);
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
    params->ep = data;
  }
  return true;
  while( true ) {
    SparseSetT<void>::InsertInternal(params->matches,true,pSVar9->inst_[uVar10 - 2]);
    uVar10 = uVar10 - 1;
    if (uVar10 < 2) break;
LAB_011cc546:
    if (pSVar9->inst_[uVar10 - 2] == -2) break;
  }
LAB_011cc591:
  params->ep = data;
  return SUB41(uVar4 >> 8,0);
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {

    if (can_prefix_accel && s == start) {
      // In start state, only way out is to find the prefix,
      // so we use prefix accel (e.g. memchr) to skip ahead.
      // If not found, we can skip to the end of the string.
      p = BytePtr(prog_->PrefixAccel(p, ep - p));
      if (p == NULL) {
        p = ep;
        break;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)

  int lastbyte;
  if (run_forward) {
    if (EndPtr(params->text) == EndPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = EndPtr(params->text)[0] & 0xFF;
  } else {
    if (BeginPtr(params->text) == BeginPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = BeginPtr(params->text)[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}